

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O2

Bitmap * __thiscall lunasvg::Bitmap::operator=(Bitmap *this,Bitmap *bitmap)

{
  plutovg_surface_t *ppVar1;
  plutovg_surface *__tmp;
  Bitmap local_10;
  
  ppVar1 = bitmap->m_surface;
  bitmap->m_surface = (plutovg_surface_t *)0x0;
  local_10 = (Bitmap)this->m_surface;
  this->m_surface = ppVar1;
  ~Bitmap(&local_10);
  return this;
}

Assistant:

Bitmap& Bitmap::operator=(Bitmap&& bitmap)
{
    Bitmap(std::move(bitmap)).swap(*this);
    return *this;
}